

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::Parse(Parser *this,string *fn)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  TiXmlElement *this_00;
  log_ostream *plVar4;
  ostream *poVar5;
  clock_t cVar6;
  allocator<char> local_1c1;
  string local_1c0 [8];
  string msg;
  TiXmlElement *elem;
  TiXmlHandle xml_handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  byte local_9d;
  bool loadOkay;
  undefined1 local_90 [8];
  TiXmlDocument doc;
  clock_t start;
  string *fn_local;
  Parser *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)fn);
  doc._104_8_ = clock();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  util::tinyxml::TiXmlDocument::TiXmlDocument((TiXmlDocument *)local_90,pcVar3);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Loading file ");
    poVar5 = std::operator<<(poVar5,(string *)this);
    std::operator<<(poVar5,"...");
  }
  local_9d = util::tinyxml::TiXmlDocument::LoadFile
                       ((TiXmlDocument *)local_90,TIXML_ENCODING_UNKNOWN);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done [");
    cVar6 = clock();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(cVar6 - doc._104_8_) / 1000000.0);
    poVar5 = std::operator<<(poVar5,"s]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = local_9d;
  iVar2 = util::tinyxml::TiXmlDocument::ErrorRow((TiXmlDocument *)local_90);
  to_string<int>(&local_160,iVar2);
  std::operator+(&local_140,"Could not load pomdpX file.\n  Line",&local_160);
  std::operator+(&local_120,&local_140,":");
  pcVar3 = util::tinyxml::TiXmlDocument::ErrorDesc((TiXmlDocument *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,pcVar3,(allocator<char> *)((long)&xml_handle.node + 7));
  std::operator+(&local_100,&local_120,&local_180);
  std::operator+(&local_e0,&local_100,"\n");
  std::operator+(&local_c0,&local_e0,
                 "  Check pomdpX file with pomdpX\'s XML schema using an XML validator.\n");
  Ensure(this,(bool)(bVar1 & 1),&local_c0,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xml_handle.node + 7));
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  util::tinyxml::TiXmlHandle::TiXmlHandle((TiXmlHandle *)&elem,(TiXmlNode *)local_90);
  util::tinyxml::TiXmlHandle::FirstChildElement((TiXmlHandle *)((long)&msg.field_2 + 8));
  this_00 = util::tinyxml::TiXmlHandle::ToElement((TiXmlHandle *)((long)&msg.field_2 + 8));
  pcVar3 = util::tinyxml::TiXmlNode::Value(&this_00->super_TiXmlNode);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,pcVar3,&local_1c1);
  std::allocator<char>::~allocator(&local_1c1);
  doc._104_8_ = clock();
  ParseDiscountTag(this,(TiXmlHandle *)&elem);
  ParseHorizonTag(this,(TiXmlHandle *)&elem);
  ParseHasTerminalTag(this,(TiXmlHandle *)&elem);
  ParseVariableTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    std::operator<<(&plVar4->super_ostream,"Parsing terminal tag...");
  }
  ParseTerminalStateTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    std::operator<<(&plVar4->super_ostream,"Parsing initial belief...");
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    logging::stream(3);
    std::ostream::flush();
  }
  ParseInitialBeliefTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    std::operator<<(&plVar4->super_ostream,"Parsing transitions...");
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    logging::stream(3);
    std::ostream::flush();
  }
  ParseStateTransitionTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    std::operator<<(&plVar4->super_ostream,"Parsing obs function...");
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    logging::stream(3);
    std::ostream::flush();
  }
  ParseObsFunctionTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    std::operator<<(&plVar4->super_ostream,"Parsing reward function...");
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    logging::stream(3);
    std::ostream::flush();
  }
  ParseRewardFunctionTag(this,(TiXmlHandle *)&elem);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Done.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar4 = logging::stream(3);
    poVar5 = std::operator<<(&plVar4->super_ostream,"Parsing done in ");
    cVar6 = clock();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(cVar6 - doc._104_8_) / 1000000.0);
    poVar5 = std::operator<<(poVar5,"s");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_1c0);
  util::tinyxml::TiXmlDocument::~TiXmlDocument((TiXmlDocument *)local_90);
  return;
}

Assistant:

void Parser::Parse(string fn) {
	file_name_ = fn;

	clock_t start = clock();
	TiXmlDocument doc(file_name_.c_str());

	// Load file
	logi << "Loading file " << file_name_ << "...";
	bool loadOkay = doc.LoadFile();
	logi << "Done [" << double(clock() - start) / CLOCKS_PER_SEC << "s]"
		<< endl;

	Ensure(loadOkay,
		"Could not load pomdpX file.\n  Line" + to_string(doc.ErrorRow()) + ":"
			+ string(doc.ErrorDesc()) + "\n"
			+ "  Check pomdpX file with pomdpX's XML schema using an XML validator.\n");

	TiXmlHandle xml_handle(&doc);
	TiXmlElement *elem = xml_handle.FirstChildElement().ToElement();
	string msg = elem->Value();

	start = clock();
	// Parse all the tags
	ParseDiscountTag(xml_handle);
	ParseHorizonTag(xml_handle);
	ParseHasTerminalTag(xml_handle);
	ParseVariableTag(xml_handle);
	logi << "Parsing terminal tag...";
	ParseTerminalStateTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing initial belief...";
	logi.flush();
	ParseInitialBeliefTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing transitions...";
	logi.flush();
	ParseStateTransitionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing obs function...";
	logi.flush();
	ParseObsFunctionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing reward function...";
	logi.flush();
	ParseRewardFunctionTag(xml_handle);
	logi << "Done." << endl;
	// cout << "Parsing terminal state reward" << endl;
	// ParseTerminalStateRewardTag(xml_handle);
	// ReadBounds();
	logi << "Parsing done in " << double(clock() - start) / CLOCKS_PER_SEC
		<< "s" << endl;
}